

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_file.c
# Opt level: O1

ion_err_t ion_fclose(ion_file_handle_t file)

{
  fclose((FILE *)file);
  return '\0';
}

Assistant:

ion_err_t
ion_fclose(
	ion_file_handle_t file
) {
#if defined(ARDUINO)
	fclose(file.file);
	return err_ok;
#else
	fclose(file);
	return err_ok;
#endif
}